

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * rbuObjIterGetBindlist(sqlite3rbu *p,int nBind)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  
  pcVar1 = (char *)rbuMalloc(p,(long)nBind * 2 + 1);
  if (pcVar1 != (char *)0x0) {
    uVar2 = (ulong)(uint)nBind;
    if (nBind < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      cVar4 = ',';
      if ((ulong)(uint)nBind - 1 == uVar3) {
        cVar4 = '\0';
      }
      pcVar1[uVar3 * 2] = '?';
      pcVar1[uVar3 * 2 + 1] = cVar4;
    }
  }
  return pcVar1;
}

Assistant:

static char *rbuObjIterGetBindlist(sqlite3rbu *p, int nBind){
  char *zRet = 0;
  sqlite3_int64 nByte = 2*(sqlite3_int64)nBind + 1;

  zRet = (char*)rbuMalloc(p, nByte);
  if( zRet ){
    int i;
    for(i=0; i<nBind; i++){
      zRet[i*2] = '?';
      zRet[i*2+1] = (i+1==nBind) ? '\0' : ',';
    }
  }
  return zRet;
}